

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_40_3_96b6a9c1 * __thiscall
qclab::qgates::lambda_PauliY<std::complex<double>>
          (anon_class_40_3_96b6a9c1 *__return_storage_ptr__,qgates *this,Op op,
          complex<double> *vector)

{
  undefined7 in_register_00000011;
  undefined8 local_60;
  anon_class_40_3_96b6a9c1 f;
  complex<double> lambda2;
  complex<double> lambda1;
  complex<double> *vector_local;
  Op op_local;
  
  std::complex<double>::complex((complex<double> *)(lambda2._M_value + 8),0.0,-1.0);
  std::complex<double>::complex((complex<double> *)(f.lambda2._M_value + 8),0.0,1.0);
  if ((char)this == 'T') {
    std::swap<std::complex<double>>
              ((complex<double> *)(lambda2._M_value + 8),(complex<double> *)(f.lambda2._M_value + 8)
              );
  }
  f.vector = (complex<double> *)lambda2._M_value._8_8_;
  f.lambda1._M_value._8_8_ = f.lambda2._M_value._8_8_;
  f.lambda2._M_value._0_8_ = lambda2._M_value._0_8_;
  local_60 = CONCAT71(in_register_00000011,op);
  memcpy(__return_storage_ptr__,&local_60,0x28);
  return __return_storage_ptr__;
}

Assistant:

auto lambda_PauliY( Op op , T* vector ) {
    // operation
    T lambda1 = T( 0 , -1 ) ;
    T lambda2 = T( 0 ,  1 ) ;
    if ( op == Op::Trans ) std::swap( lambda1 , lambda2 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      std::swap( vector[a] , vector[b] ) ;
      vector[a] *= lambda1 ;
      vector[b] *= lambda2 ;
    } ;
    return f ;
  }